

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O1

PAL_ERROR __thiscall CorUnix::CSimpleHandleManager::Initialize(CSimpleHandleManager *this)

{
  uint uVar1;
  PAL_ERROR PVar2;
  HANDLE_TABLE_ENTRY *pHVar3;
  long lVar4;
  ulong uVar5;
  
  InternalInitializeCriticalSection(&this->m_csLock);
  this->m_fLockInitialized = true;
  this->m_dwTableSize = 0x400;
  this->m_dwTableGrowthRate = 0x400;
  pHVar3 = (HANDLE_TABLE_ENTRY *)InternalMalloc(0x4000);
  this->m_rghteHandleTable = pHVar3;
  if (pHVar3 == (HANDLE_TABLE_ENTRY *)0x0) {
    PVar2 = 0xe;
  }
  else {
    uVar1 = this->m_dwTableSize;
    if (uVar1 != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        *(ulong *)((long)&this->m_rghteHandleTable->u + lVar4) = uVar5;
        (&this->m_rghteHandleTable->fEntryAllocated)[lVar4] = false;
        uVar1 = this->m_dwTableSize;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < uVar1);
    }
    this->m_rghteHandleTable[uVar1 - 1].u.hiNextIndex = 0xffffffffffffffff;
    this->m_hiFreeListStart = 0;
    this->m_hiFreeListEnd = (ulong)(this->m_dwTableSize - 1);
    PVar2 = 0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar2;
  }
  abort();
}

Assistant:

PAL_ERROR
CSimpleHandleManager::Initialize(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;
    
    InternalInitializeCriticalSection(&m_csLock);
    m_fLockInitialized = TRUE;

    m_dwTableGrowthRate = c_BasicGrowthRate;

    /* initialize the handle table - the free list is stored in the 'object'
       field, with the head in the global 'm_hiFreeListStart'. */
    m_dwTableSize = m_dwTableGrowthRate;
    
    m_rghteHandleTable = reinterpret_cast<HANDLE_TABLE_ENTRY*>(InternalMalloc((m_dwTableSize * sizeof(HANDLE_TABLE_ENTRY))));
    if(NULL == m_rghteHandleTable)
    {
        ERROR("Unable to create initial handle table array");
        palError = ERROR_OUTOFMEMORY;
        goto InitializeExit;
    }

    for (DWORD i = 0; i < m_dwTableSize; i++)
    {
        m_rghteHandleTable[i].u.hiNextIndex = i + 1;
        m_rghteHandleTable[i].fEntryAllocated = FALSE;
    }

    m_rghteHandleTable[m_dwTableSize - 1].u.hiNextIndex = (HANDLE_INDEX)-1;
    
    m_hiFreeListStart = 0;
    m_hiFreeListEnd = m_dwTableSize - 1;

    TRACE("Handle Manager initialization complete.\n");

InitializeExit:
    
    return palError;
}